

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O1

void __thiscall CompoundFile::Directory::load(Directory *this,Stream *stream)

{
  pointer pwVar1;
  unsigned_short uVar2;
  int iVar3;
  Exception *this_00;
  ushort uVar4;
  uint16_t symbol;
  vector<unsigned_short,_std::allocator<unsigned_short>_> data;
  unsigned_short local_5a;
  wstring local_58;
  
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_58,0x1f);
  uVar4 = 1;
  do {
    local_5a = 0;
    Excel::Stream::read<unsigned_short>(&stream->super_Stream,&local_5a,2);
    uVar2 = local_5a;
    if (local_5a == 0) goto LAB_0011f06c;
    if (local_58._M_string_length == local_58.field_2._M_allocated_capacity) {
      std::vector<unsigned_short,std::allocator<unsigned_short>>::
      _M_realloc_insert<unsigned_short_const&>
                ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_58,
                 (iterator)local_58._M_string_length,&local_5a);
    }
    else {
      *(unsigned_short *)local_58._M_string_length = local_5a;
      local_58._M_string_length = local_58._M_string_length + 2;
    }
    if (uVar2 == 0) goto LAB_0011f06c;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x21);
  uVar4 = 0x21;
LAB_0011f06c:
  pwVar1 = (this->m_name)._M_dataplus._M_p;
  std::__cxx11::wstring::
  _M_replace_dispatch<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
            ((wstring *)this,pwVar1,pwVar1 + (this->m_name)._M_string_length,
             local_58._M_dataplus._M_p,local_58._M_string_length);
  if (uVar4 < 0x20) {
    (*(stream->super_Stream)._vptr_Stream[4])(stream,(ulong)(ushort)(uVar4 * -2 + 0x40),1);
  }
  if (local_58._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58._M_dataplus._M_p,
                    local_58.field_2._M_allocated_capacity - (long)local_58._M_dataplus._M_p);
  }
  (*(stream->super_Stream)._vptr_Stream[4])(stream,2,1);
  iVar3 = (*(stream->super_Stream)._vptr_Stream[2])(stream);
  this->m_type = (int)(char)iVar3;
  iVar3 = (*(stream->super_Stream)._vptr_Stream[3])(stream);
  if ((char)iVar3 == '\0') {
    (*(stream->super_Stream)._vptr_Stream[4])(stream,1,1);
    Excel::Stream::read<int>(&stream->super_Stream,&this->m_leftChild,4);
    Excel::Stream::read<int>(&stream->super_Stream,&this->m_rightChild,4);
    Excel::Stream::read<int>(&stream->super_Stream,&this->m_rootNode,4);
    (*(stream->super_Stream)._vptr_Stream[4])(stream,0x24,1);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
    Excel::Stream::read<int>(&stream->super_Stream,(int *)&local_58,4);
    (this->m_secID).m_id = (int32_t)local_58._M_dataplus._M_p;
    Excel::Stream::read<int>(&stream->super_Stream,&this->m_streamSize,4);
    (*(stream->super_Stream)._vptr_Stream[4])(stream,4,1);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_58,L"Unexpected end of file.",L"");
  Exception::Exception(this_00,&local_58);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
Directory::load( Stream & stream )
{
	{
		const int16_t maxSymbolsInName = 32;

		int16_t i = 1;

		std::vector< uint16_t > data;
		data.reserve( maxSymbolsInName - 1 );

		for( ; i <= maxSymbolsInName; ++i )
		{
			uint16_t symbol = 0;
			stream.read( symbol, 2 );

			if( symbol != 0 )
				data.push_back( symbol );
			else
				break;
		}

		m_name.assign( data.begin(), data.end() );

		if( i < maxSymbolsInName )
			stream.seek( ( maxSymbolsInName - i ) * 2, Stream::FromCurrent );
	}

	stream.seek( 2, Stream::FromCurrent );
	m_type = (Type)(int32_t) stream.getByte();

	if( stream.eof() )
		throw Exception( L"Unexpected end of file." );

	stream.seek( 1, Stream::FromCurrent );
	stream.read( m_leftChild, 4 );
	stream.read( m_rightChild, 4 );
	stream.read( m_rootNode, 4 );
	stream.seek( 36, Stream::FromCurrent );

	{
		int32_t sec = 0;
		stream.read( sec, 4 );
		m_secID = sec;
	}

	stream.read( m_streamSize, 4 );
	stream.seek( 4, Stream::FromCurrent );
}